

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoaderThread.cpp
# Opt level: O1

void __thiscall LoaderThread::Launch(LoaderThread *this,char *filename,uint32_t octree_level)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Ptr_type _Var3;
  _State_baseV2 *__tmp;
  uint32_t local_64;
  char *local_60;
  promise<std::shared_ptr<OctreeBuilder>_> local_58;
  LoaderThread *local_38;
  promise<std::shared_ptr<OctreeBuilder>_> local_30;
  
  if ((this->m_thread)._M_id._M_thread == 0) {
    local_64 = octree_level;
    local_60 = filename;
    std::promise<std::shared_ptr<OctreeBuilder>_>::promise(&local_30);
    _Var3._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>.
    _M_head_impl = local_30._M_storage._M_t.
                   super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
                   .
                   super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>
                   ._M_head_impl;
    _Var2._M_pi = local_30._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_30._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_30._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter,_true,_true>
                    )(__uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
                      )0x0;
    local_30._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_promise)._M_future.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (this->m_promise)._M_future.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    (this->m_promise)._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->m_promise)._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    local_58._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter,_true,_true>
                    )(this->m_promise)._M_storage._M_t.
                     super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
                     .
                     super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>
                     ._M_head_impl;
    (this->m_promise)._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>.
    _M_head_impl = (_Result<std::shared_ptr<OctreeBuilder>_> *)
                   _Var3._M_t.
                   super___uniq_ptr_impl<std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>,_std::__future_base::_Result_base::_Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_std::__future_base::_Result_base::_Deleter>
                   .
                   super__Head_base<0UL,_std::__future_base::_Result<std::shared_ptr<OctreeBuilder>_>_*,_false>
                   ._M_head_impl;
    std::promise<std::shared_ptr<OctreeBuilder>_>::~promise(&local_58);
    std::promise<std::shared_ptr<OctreeBuilder>_>::~promise(&local_30);
    std::__basic_future<std::shared_ptr<OctreeBuilder>_>::__basic_future
              ((__basic_future<std::shared_ptr<OctreeBuilder>_> *)&local_58,
               &(this->m_promise)._M_future);
    _Var2._M_pi = local_58._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_58._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->m_future).super___basic_future<std::shared_ptr<OctreeBuilder>_>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_future).super___basic_future<std::shared_ptr<OctreeBuilder>_>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->m_future).super___basic_future<std::shared_ptr<OctreeBuilder>_>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_58._M_future.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58._M_future.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)thread_func;
    local_58._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38 = this;
    std::thread::
    thread<void(LoaderThread::*)(char_const*,unsigned_int),LoaderThread*,char_const*&,unsigned_int&,void>
              ((thread *)&local_30,(offset_in_LoaderThread_to_subr *)&local_58,&local_38,&local_60,
               &local_64);
    if ((this->m_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->m_thread)._M_id._M_thread =
         (native_handle_type)
         local_30._M_future.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  return;
}

Assistant:

void LoaderThread::Launch(const char *filename, uint32_t octree_level) {
	if (IsRunning())
		return;
	m_promise = std::promise<std::shared_ptr<OctreeBuilder>>();
	m_future = m_promise.get_future();
	m_thread = std::thread(&LoaderThread::thread_func, this, filename, octree_level);
}